

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::CommitAppend(DataTable *this,transaction_t commit_id,idx_t row_start,idx_t count)

{
  RowGroupCollection *this_00;
  
  ::std::mutex::lock(&this->append_lock);
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::CommitAppend(this_00,commit_id,row_start,count);
  pthread_mutex_unlock((pthread_mutex_t *)&this->append_lock);
  return;
}

Assistant:

void DataTable::CommitAppend(transaction_t commit_id, idx_t row_start, idx_t count) {
	lock_guard<mutex> lock(append_lock);
	row_groups->CommitAppend(commit_id, row_start, count);
}